

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DriverProxy.h
# Opt level: O3

int64_t __thiscall
aeron::DriverProxy::addCounter
          (DriverProxy *this,int32_t typeId,uint8_t *key,size_t keyLength,string *label)

{
  long *plVar1;
  int64_t correlationId;
  int32_t local_54;
  long local_50;
  size_t local_48;
  uint8_t *local_40;
  anon_class_48_6_e1d6f653 local_38;
  
  local_38.typeId = &local_54;
  local_38.key = &local_40;
  local_38.keyLength = &local_48;
  LOCK();
  plVar1 = (long *)(this->m_toDriverCommandBuffer->m_buffer->m_buffer +
                   this->m_toDriverCommandBuffer->m_correlationIdCounterIndex);
  local_50 = *plVar1;
  *plVar1 = *plVar1 + 1;
  UNLOCK();
  local_38.correlationId = &local_50;
  local_54 = typeId;
  local_48 = keyLength;
  local_40 = key;
  local_38.this = this;
  local_38.label = label;
  writeCommandToDriver<aeron::DriverProxy::addCounter(int,unsigned_char_const*,unsigned_long,std::__cxx11::string_const&)::_lambda(aeron::concurrent::AtomicBuffer&,int&)_1_>
            (this,&local_38);
  return local_50;
}

Assistant:

std::int64_t addCounter(std::int32_t typeId, const std::uint8_t *key, std::size_t keyLength, const std::string& label)
    {
        std::int64_t correlationId = m_toDriverCommandBuffer.nextCorrelationId();

        writeCommandToDriver([&](AtomicBuffer &buffer, util::index_t &length)
        {
            CounterMessageFlyweight command(buffer, 0);

            command.clientId(m_clientId);
            command.correlationId(correlationId);
            command.typeId(typeId);
            command.keyBuffer(key, keyLength);
            command.label(label);

            length = command.length();

            return ControlProtocolEvents::ADD_COUNTER;
        });

        return correlationId;
    }